

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

void __thiscall
spvtools::EnumSet<spvtools::Extension>::InsertBucketFor
          (EnumSet<spvtools::Extension> *this,size_t index,Extension value)

{
  bool bVar1;
  Extension EVar2;
  ElementType EVar3;
  pointer pBVar4;
  bool bVar5;
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_88;
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_80;
  Bucket *local_78;
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_70;
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_68;
  Bucket *local_60;
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_58;
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_50;
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_48;
  const_iterator local_40;
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_38;
  iterator it;
  Bucket bucket;
  Extension bucket_start;
  Extension value_local;
  size_t index_local;
  EnumSet<spvtools::Extension> *this_local;
  
  EVar2 = ComputeBucketStart(value);
  EVar3 = ComputeBucketOffset(value);
  it._M_current = (Bucket *)(1L << ((byte)EVar3 & 0x3f));
  local_50._M_current =
       (Bucket *)
       std::
       vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
       ::begin(&this->buckets_);
  local_48 = __gnu_cxx::
             __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
             ::operator+(&local_50,index);
  __gnu_cxx::
  __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_const*,std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>>>
  ::__normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket*>
            ((__normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_const*,std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>>>
              *)&local_40,&local_48);
  local_60 = (Bucket *)
             std::
             vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
             ::emplace<spvtools::EnumSet<spvtools::Extension>::Bucket>
                       (&this->buckets_,local_40,(Bucket *)&it);
  local_38._M_current = local_60;
  local_58 = std::
             next<__gnu_cxx::__normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket*,std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>>>>
                       ((__normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
                         )local_60,1);
  local_68._M_current =
       (Bucket *)
       std::
       vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
       ::end(&this->buckets_);
  bVar1 = __gnu_cxx::operator==(&local_58,&local_68);
  bVar5 = true;
  if (!bVar1) {
    local_78 = local_38._M_current;
    local_70 = std::
               next<__gnu_cxx::__normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket*,std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>>>>
                         (local_38,1);
    pBVar4 = __gnu_cxx::
             __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
             ::operator->(&local_70);
    bVar5 = EVar2 < pBVar4->start;
  }
  if (!bVar5) {
    __assert_fail("std::next(it) == buckets_.end() || std::next(it)->start > bucket_start",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                  ,0x1af,
                  "void spvtools::EnumSet<spvtools::Extension>::InsertBucketFor(size_t, T) [T = spvtools::Extension]"
                 );
  }
  local_80._M_current =
       (Bucket *)
       std::
       vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
       ::begin(&this->buckets_);
  bVar1 = __gnu_cxx::operator==(&local_38,&local_80);
  bVar5 = true;
  if (!bVar1) {
    local_88 = std::
               prev<__gnu_cxx::__normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket*,std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>>>>
                         (local_38,1);
    pBVar4 = __gnu_cxx::
             __normal_iterator<spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
             ::operator->(&local_88);
    bVar5 = pBVar4->start < EVar2;
  }
  if (!bVar5) {
    __assert_fail("it == buckets_.begin() || std::prev(it)->start < bucket_start",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/enum_set.h"
                  ,0x1b0,
                  "void spvtools::EnumSet<spvtools::Extension>::InsertBucketFor(size_t, T) [T = spvtools::Extension]"
                 );
  }
  return;
}

Assistant:

void InsertBucketFor(size_t index, T value) {
    const T bucket_start = ComputeBucketStart(value);
    Bucket bucket = {1ULL << ComputeBucketOffset(value), bucket_start};
    auto it = buckets_.emplace(buckets_.begin() + index, std::move(bucket));
#if defined(NDEBUG)
    (void)it;  // Silencing unused variable warning.
#else
    assert(std::next(it) == buckets_.end() ||
           std::next(it)->start > bucket_start);
    assert(it == buckets_.begin() || std::prev(it)->start < bucket_start);
#endif
  }